

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

void __thiscall CVmObjTads::apply_undo(CVmObjTads *this,CVmUndoRecord *rec)

{
  vm_tadsobj_prop *pvVar1;
  int iVar2;
  uint uVar3;
  vm_tadsobj_hdr *this_00;
  vm_tadsobj_prop *pvVar4;
  long in_RSI;
  vm_val_t *in_RDI;
  uint hash;
  vm_tadsobj_prop **prv;
  vm_tadsobj_prop *cur;
  vm_tadsobj_prop *entry;
  vm_tadsobj_hdr *hdr;
  uint in_stack_ffffffffffffffb4;
  vm_tadsobj_hdr *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffd0;
  int cnt;
  vm_tadsobj_prop **ppvVar5;
  vm_val_t *in_stack_ffffffffffffffd8;
  CVmObjTads *in_stack_ffffffffffffffe0;
  
  cnt = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  this_00 = get_hdr((CVmObjTads *)in_RDI);
  if (*(short *)(in_RSI + 8) == 0) {
    if (*(int *)(in_RSI + 0x10) == 7) {
      if (*(int *)(in_RSI + 0x18) == 1) {
        this_00->intern_obj_flags = this_00->intern_obj_flags & 0xfffd;
      }
    }
    else {
      iVar2 = vm_val_t::is_listlike(in_RDI);
      if (iVar2 != 0) {
        vm_val_t::ll_length((vm_val_t *)(in_RSI + 0x10));
        change_superclass_list(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,cnt);
      }
    }
  }
  else {
    pvVar4 = vm_tadsobj_hdr::find_prop_entry(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    if (pvVar4 != (vm_tadsobj_prop *)0x0) {
      *(undefined8 *)&pvVar4->val = *(undefined8 *)(in_RSI + 0x10);
      (pvVar4->val).val = *(anon_union_8_8_cb74652f_for_val *)(in_RSI + 0x18);
      if (*(int *)(in_RSI + 0x10) == 0xd) {
        uVar3 = vm_tadsobj_hdr::calc_hash(this_00,(uint)*(ushort *)(in_RSI + 8));
        if (*(int *)(in_RSI + 0x18) == 0) {
          ppvVar5 = this_00->hash_arr + uVar3;
          while (pvVar1 = *ppvVar5, pvVar1 != (vm_tadsobj_prop *)0x0 && pvVar1 != pvVar4) {
            ppvVar5 = &pvVar1->nxt;
          }
          if (pvVar1 == pvVar4) {
            *ppvVar5 = pvVar4->nxt;
            this_00->prop_entry_free = this_00->prop_entry_free - 1;
          }
        }
        else if (*(int *)(in_RSI + 0x18) == 1) {
          pvVar4->flags = pvVar4->flags & 0xfe;
        }
      }
    }
  }
  return;
}

Assistant:

void CVmObjTads::apply_undo(VMG_ CVmUndoRecord *rec)
{
    /* get my header */
    vm_tadsobj_hdr *hdr = get_hdr();

    /* 
     *   if the property is valid, it's a simple property change record;
     *   otherwise it's some other object-level change 
     */
    if (rec->id.prop == VM_INVALID_PROP)
    {
        /*
         *   Invalid property ID, so it's an object-level change:
         *   
         *   - int(1) -> object is newly modified (VMTO_OBJ_MOD flag was
         *   newly set)
         *   
         *   - list -> superclass list change
         */
        switch (rec->oldval.typ)
        {
        case VM_INT:
            switch (rec->oldval.val.intval)
            {
            case 1:
                /* VMTO_OBJ_MOD flag newly set - clear the flag */
                hdr->intern_obj_flags &= ~VMTO_OBJ_MOD;
                break;
            }
            break;

        default:
            /* check for a list, which indicates a superclass change */
            if (rec->oldval.is_listlike(vmg0_))
            {
                /* set the new superclass list */
                change_superclass_list(
                    vmg_ &rec->oldval, rec->oldval.ll_length(vmg0_));
            }
            break;
        }
    }
    else
    {
        /* find the property entry for the property being undone */
        vm_tadsobj_prop *entry = hdr->find_prop_entry(rec->id.prop);
        if (entry == 0)
        {
            /* can't find the property - something is out of whack */
            assert(FALSE);
            return;
        }
        
        /* restore the value from the record */
        entry->val = rec->oldval;
        
        /* if the old value is 'empty', it requires special handling */
        if (rec->oldval.typ == VM_EMPTY)
        {
            vm_tadsobj_prop *cur, **prv;
            unsigned int hash = hdr->calc_hash(rec->id.prop);
            
            /* 
             *   We use 'empty' records for multiple purposes, with the
             *   specific one indicated by the intval field. 
             */
            switch (rec->oldval.val.intval)
            {
            case 0:
                /*
                 *   Empty with intval 0 indicates a property addition, which
                 *   we undo by deleting the property.  First, find it in the
                 *   hash chain.  
                 */
                for (prv = &hdr->hash_arr[hash] ;
                     (cur = *prv) != 0 && cur != entry ;
                     prv = &cur->nxt) ;
                
                /* make sure we found it */
                if (cur == entry)
                {
                    /* unlink it */
                    *prv = entry->nxt;
                    
                    /* return it to the free list */
                    hdr->prop_entry_free -= 1;
                    assert(entry == &hdr->prop_entry_arr[hdr->prop_entry_free]);
                }
                else
                {
                    /* this should be impossible */
                    assert(FALSE);
                }
                break;
                
            case 1:
                /*
                 *   Empty with intval 1 indicates that we marked the slot as
                 *   newly modified, which we undo by clearing the modified
                 *   flag.
                 */
                entry->flags &= ~VMTO_PROP_MOD;
                break;
            }
        }
    }
}